

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_speech(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  LINE_DATA *str;
  char *pcVar5;
  char *in_RSI;
  long in_RDI;
  int type;
  LINE_DATA *new_line;
  LINE_DATA *lptr;
  char arg5 [4608];
  char arg4 [4608];
  char arg3 [4608];
  char name [4608];
  char cmd [4608];
  char buf [4608];
  SPEECH_DATA *sptr;
  SPEECH_DATA *speech;
  MOB_INDEX_DATA *pMobIndex;
  char *in_stack_ffffffffffff9388;
  SPEECH_DATA *in_stack_ffffffffffff9390;
  undefined4 in_stack_ffffffffffff9398;
  int in_stack_ffffffffffff939c;
  char *in_stack_ffffffffffff93a0;
  undefined4 in_stack_ffffffffffff93b0;
  uint uVar6;
  undefined4 in_stack_ffffffffffff93b4;
  char *in_stack_ffffffffffff93b8;
  LINE_DATA *local_6c40;
  char local_5a38 [4608];
  char local_4838 [4608];
  char local_3638;
  char local_1238 [4616];
  SPEECH_DATA *local_30;
  SPEECH_DATA *local_28;
  long local_20;
  char *local_18;
  
  local_20 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if (*in_RSI == '\0') {
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
    send_to_char(in_stack_ffffffffffff93a0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
  }
  else {
    local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
    local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
    local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
    local_28 = find_speech((MOB_INDEX_DATA *)
                           CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398),
                           (char *)in_stack_ffffffffffff9390);
    if (local_28 == (SPEECH_DATA *)0x0) {
      bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                         (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
      if (bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                           (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
        if (!bVar2) {
          if (local_3638 == '\0') {
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          local_28 = new_speech_data();
          pcVar5 = palloc_string(in_stack_ffffffffffff93b8);
          local_28->name = pcVar5;
          if (*(long *)(local_20 + 0x30) == 0) {
            *(SPEECH_DATA **)(local_20 + 0x30) = local_28;
          }
          else {
            for (local_30 = *(SPEECH_DATA **)(local_20 + 0x30); local_30->next != (SPEECH_DATA *)0x0
                ; local_30 = local_30->next) {
            }
            local_30->next = local_28;
            local_28->prev = local_30;
          }
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return true;
        }
        bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                           (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
        if (!bVar2) {
          if (local_3638 == '\0') {
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          local_28 = find_speech((MOB_INDEX_DATA *)
                                 CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398),
                                 (char *)in_stack_ffffffffffff9390);
          if (local_28 == (SPEECH_DATA *)0x0) {
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          free_speech(in_stack_ffffffffffff9390);
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return true;
        }
        bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                           (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
        if (bVar2) {
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return false;
        }
      }
      else {
        if (*(long *)(local_20 + 0x30) == 0) {
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return false;
        }
        send_to_char(in_stack_ffffffffffff93a0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
        for (local_30 = *(SPEECH_DATA **)(local_20 + 0x30); local_30 != (SPEECH_DATA *)0x0;
            local_30 = local_30->next) {
          sprintf(local_1238,"%s\n\r",local_30->name);
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
        }
      }
    }
    else {
      sort_speech(local_28);
      bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                         (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
      if (!bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                           (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
        if (bVar2) {
          bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                             (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
          if (!bVar2) {
            local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
            local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
            str = new_line_data();
            iVar3 = atoi(local_5a38);
            str->delay = iVar3;
            iVar3 = flag_lookup((char *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398
                                                ),(flag_type *)in_stack_ffffffffffff9390);
            if (iVar3 == -99) {
              send_to_char(in_stack_ffffffffffff93a0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
              return false;
            }
            str->type = (short)iVar3;
            pcVar5 = palloc_string((char *)str);
            str->text = pcVar5;
            for (local_6c40 = local_28->first_line; local_6c40->next != (LINE_DATA *)0x0;
                local_6c40 = local_6c40->next) {
              local_6c40->next = str;
            }
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return true;
          }
          local_18 = one_argument((char *)in_stack_ffffffffffff9390,in_stack_ffffffffffff9388);
          for (local_6c40 = local_28->first_line; local_6c40 != (LINE_DATA *)0x0;
              local_6c40 = local_6c40->next) {
            in_stack_ffffffffffff939c = local_6c40->number;
            iVar3 = atoi(local_4838);
            if (in_stack_ffffffffffff939c == iVar3) break;
          }
          if (local_6c40 == (LINE_DATA *)0x0) {
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          bVar2 = str_cmp(local_5a38,"delete");
          if (!bVar2) {
            if (local_6c40 != (LINE_DATA *)0x0) {
              operator_delete(local_6c40,0x30);
            }
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return true;
          }
          bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                             (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
          if (!bVar2) {
            iVar3 = atoi(local_18);
            local_6c40->delay = iVar3;
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return true;
          }
          bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                             (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
          if (!bVar2) {
            iVar3 = atoi(local_18);
            local_6c40->number = iVar3;
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return true;
          }
          bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                             (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0));
          if (bVar2) {
            bVar2 = str_prefix(in_stack_ffffffffffff93b8,
                               (char *)CONCAT44(in_stack_ffffffffffff93b4,in_stack_ffffffffffff93b0)
                              );
            if (!bVar2) {
              free_pstring((char *)in_stack_ffffffffffff9390);
              pcVar5 = palloc_string(in_stack_ffffffffffff93b8);
              local_6c40->text = pcVar5;
              send_to_char(in_stack_ffffffffffff93a0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
              return true;
            }
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          iVar3 = flag_lookup((char *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398),
                              (flag_type *)in_stack_ffffffffffff9390);
          if (iVar3 == -99) {
            send_to_char(in_stack_ffffffffffff93a0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398))
            ;
            return false;
          }
          local_6c40->type = (short)iVar3;
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return true;
        }
        if (local_28->first_line == (LINE_DATA *)0x0) {
          send_to_char(in_stack_ffffffffffff93a0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
          return false;
        }
        sprintf(local_1238,"%s Lines:\n\r",local_28->name);
        send_to_char(in_stack_ffffffffffff93a0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
        for (local_6c40 = local_28->first_line; local_6c40 != (LINE_DATA *)0x0;
            local_6c40 = local_6c40->next) {
          pcVar5 = local_1238;
          uVar1 = local_6c40->number;
          uVar6 = local_6c40->delay;
          pcVar4 = flag_name_lookup(CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398),
                                    (flag_type *)in_stack_ffffffffffff9390);
          sprintf(pcVar5,"Line #%d: %d %s %s\n\r",(ulong)uVar1,(ulong)uVar6,pcVar4,local_6c40->text)
          ;
          send_to_char(pcVar5,(CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffff939c,in_stack_ffffffffffff9398));
        }
      }
    }
    if (local_28 != (SPEECH_DATA *)0x0) {
      sort_speech(local_28);
    }
  }
  return true;
}

Assistant:

bool medit_speech(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	SPEECH_DATA *speech, *sptr;
	char buf[MSL], cmd[MSL], name[MSL], arg3[MSL], arg4[MSL], arg5[MSL];
	LINE_DATA *lptr, *new_line;
	int type;

	EDIT_MOB(ch, pMobIndex);

	if (!*argument)
	{
		send_to_char("The following speech commands are available:\n\r", ch);
		send_to_char("   speech list\n\r", ch);
		send_to_char("   speech add <speech_name>\n\r", ch);
		send_to_char("   speech del <speech_name>\n\r", ch);
		send_to_char("   speech <speech_name> line add <#delay> <type> <text>\n\r", ch);
		send_to_char("   speech <speech_name> line list\n\r", ch);
		send_to_char("   speech <speech_name> line <#> text <text>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delay <#>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> type <type>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delete\n\r", ch);
		/* list commands */
	}
	else
	{
		argument = one_argument(argument, cmd);
		argument = one_argument(argument, name);
		argument = one_argument(argument, arg3);

		speech = find_speech(pMobIndex, cmd);

		if (speech != nullptr)
		{
			sort_speech(speech);

			if (!str_prefix(name, "line"))
			{
				if (!str_prefix(arg3, "list"))
				{
					if (!speech->first_line)
					{
						send_to_char("This speech has no lines.\n\r", ch);
						return false;
					}

					sprintf(buf, "%s Lines:\n\r", speech->name);
					send_to_char(buf, ch);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						sprintf(buf, "Line #%d: %d %s %s\n\r",
							lptr->number,
							lptr->delay,
							flag_name_lookup(lptr->type, speech_table),
							lptr->text);
						send_to_char(buf, ch);
					}
				}
				else if (!str_prefix(arg3, "add"))
				{
					argument = one_argument(argument, arg4);
					argument = one_argument(argument, arg5);
					new_line = new_line_data();

					new_line->delay = atoi(arg4);
					type = flag_lookup(arg5, speech_table);

					if (type == NO_FLAG)
					{
						send_to_char("Not a valid type.\n\r", ch);
						return false;
					}

					new_line->type = type;
					new_line->text = palloc_string(argument);

					for (lptr = speech->first_line; lptr->next != nullptr; lptr = lptr->next)
					{
						lptr->next = new_line;
					}

					send_to_char("Added.\n\r", ch);
					return true;
				}
				else
				{
					argument = one_argument(argument, arg4);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						if (lptr->number == atoi(arg3))
							break;
					}

					if (!lptr)
					{
						send_to_char("Not a valid line number.\n\r", ch);
						return false;
					}
					else
					{
						if (!str_cmp(arg4, "delete"))
						{
							delete lptr;
							send_to_char("Deleted.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "delay"))
						{
							lptr->delay = atoi(argument);
							send_to_char("Delay set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "number"))
						{
							lptr->number = atoi(argument);
							send_to_char("Number set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "type"))
						{
							type = flag_lookup(argument, speech_table);

							if (type == NO_FLAG)
							{
								send_to_char("Not a valid type.\n\r", ch);
								return false;
							}

							lptr->type = type;
							send_to_char("Type set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "text"))
						{
							free_pstring(lptr->text);
							lptr->text = palloc_string(argument);

							send_to_char("Text set.\n\r", ch);
							return true;
						}
						else
						{
							send_to_char("Not a valid entry.\n\r", ch);
							return false;
						}
					}
				}
			}
		}
		else if (!str_prefix(cmd, "list"))
		{
			if (!pMobIndex->speech)
			{
				send_to_char("Mobile has no speeches defined.\n\r", ch);
				return false;
			}

			send_to_char("Mobile has the following speeches defined:\n\r", ch);

			for (sptr = pMobIndex->speech; sptr; sptr = sptr->next)
			{
				sprintf(buf, "%s\n\r", sptr->name);
				send_to_char(buf, ch);
			}
		}
		else if (!str_prefix(cmd, "add"))
		{
			if (!*name)
			{
				send_to_char("You must specify a name for the new speech.\n\r", ch);
				return false;
			}

			speech = new_speech_data();
			speech->name = palloc_string(name);

			if (!pMobIndex->speech)
			{
				pMobIndex->speech = speech;
			}
			else
			{
				for (sptr = pMobIndex->speech; sptr->next; sptr = sptr->next);
				sptr->next = speech;
				speech->prev = sptr;
			}

			send_to_char("Speech added.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "del"))
		{
			if (!*name)
			{
				send_to_char("Delete which speech?\n\r", ch);
				return false;
			}

			speech = find_speech(pMobIndex, name);

			if (!speech)
			{
				send_to_char("No speech by that name found.\n\r", ch);
				return false;
			}

			free_speech(speech);
			send_to_char("Speech deleted.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "edit"))
		{
			/* blah */
		}
		else
		{
			send_to_char("Invalid speech command.\n\r", ch);
			return false;
		}

		if (speech)
			sort_speech(speech);
	}

	return true;
}